

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_basic_string_only<toml::type_config>
            (result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  toml tVar1;
  value_type *pvVar2;
  error_type *this;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_00;
  error_info *v;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
  *v_00;
  EVP_PKEY_CTX *ctx_00;
  _Alloc_hider this_00;
  string_type val;
  string str;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  esc;
  location loc2;
  region reg;
  location first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string local_398;
  anon_union_136_2_fd5fb55d_for_result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>_3
  *local_378;
  string local_370;
  string local_350;
  undefined1 local_330 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  undefined1 local_310 [104];
  undefined1 local_2a8 [48];
  size_t local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260 [3];
  long local_228;
  long local_210;
  location local_1f8;
  location local_1b0;
  EVP_PKEY_CTX local_168 [88];
  failure<toml::error_info> local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
  local_b8;
  
  location::location(&local_1b0,loc);
  syntax::basic_string((sequence *)local_330,&ctx->toml_spec_);
  sequence::scan((region *)local_260,(sequence *)local_330,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_330 + 8));
  if ((long *)local_260[0]._0_8_ == (long *)0x0) {
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_350,"toml::parse_basic_string: invalid string format","");
    syntax::basic_string((sequence *)local_2a8,&ctx->toml_spec_);
    location::location(&local_1f8,loc);
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"");
    make_syntax_error<toml::detail::sequence>
              ((error_info *)local_330,&local_350,(sequence *)local_2a8,&local_1f8,&local_370);
    err<toml::error_info>(&local_110,(error_info *)local_330);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_110);
    failure<toml::error_info>::~failure(&local_110);
    if ((pointer)local_310._24_8_ != (pointer)(local_310 + 0x28)) {
      operator_delete((void *)local_310._24_8_,local_310._40_8_ + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_330._1_7_,local_330[0]) != &local_320) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_330._1_7_,local_330[0]),
                      (ulong)(local_320._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    location::~location(&local_1f8);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_2a8 + 8));
    local_398._M_dataplus._M_p = local_350._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p == &local_350.field_2) goto LAB_0036e660;
  }
  else {
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_398,(detail *)(local_228 + *(long *)local_260[0]._0_8_),
               (uchar *)(*(long *)local_260[0]._0_8_ + local_210),in_RCX);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398,0,1);
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    local_3b8._M_string_length = 0;
    local_3b8.field_2._M_local_buf[0] = '\0';
    if (local_398._M_string_length != 0) {
      first_00._M_current = local_398._M_dataplus._M_p + local_398._M_string_length;
      local_378 = &__return_storage_ptr__->field_1;
      this_00._M_p = local_398._M_dataplus._M_p;
      do {
        if (*this_00._M_p == '\\') {
          make_string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)local_330,(detail *)this_00._M_p,first_00,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )in_RCX._M_current);
          make_temporary_location((location *)local_2a8,(string *)local_330);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_330._1_7_,local_330[0]) != &local_320) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_330._1_7_,local_330[0]),
                            (ulong)(local_320._M_allocated_capacity + 1));
          }
          parse_escape_sequence<toml::type_config>
                    ((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                      *)local_330,(location *)local_2a8,ctx);
          tVar1 = local_330[0];
          if (local_330[0] == (toml)0x0) {
            this = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                   ::unwrap_err((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                 *)local_330,(source_location)0x4e0f40);
            err<toml::error_info&>((failure<toml::error_info> *)local_168,(toml *)this,v);
            __return_storage_ptr__->is_ok_ = false;
            ctx_00 = local_168;
            failure<toml::error_info>::failure
                      ((failure<toml::error_info> *)&local_378->succ_,
                       (failure<toml::error_info> *)local_168);
            failure<toml::error_info>::~failure((failure<toml::error_info> *)local_168);
          }
          else {
            pvVar2 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                     ::unwrap((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                               *)local_330,(source_location)0x4e0f58);
            ctx_00 = (EVP_PKEY_CTX *)(pvVar2->_M_dataplus)._M_p;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_3b8,(char *)ctx_00,pvVar2->_M_string_length);
            this_00._M_p = this_00._M_p + local_278;
          }
          result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
          ::cleanup((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                     *)local_330,ctx_00);
          location::~location((location *)local_2a8);
          if (tVar1 == (toml)0x0) goto LAB_0036e4cb;
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(&local_3b8,*this_00._M_p);
          this_00._M_p = this_00._M_p + 1;
        }
        first_00._M_current = local_398._M_dataplus._M_p + local_398._M_string_length;
      } while (this_00._M_p != first_00._M_current);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_toml::detail::region_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
                *)local_330,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8,
               (region *)local_260);
    ok<std::pair<std::__cxx11::string,toml::detail::region>>
              ((success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
                *)&local_b8,(toml *)local_330,v_00);
    __return_storage_ptr__->is_ok_ = true;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
    ::pair(&(__return_storage_ptr__->field_1).succ_.value,&local_b8);
    success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
    ::~success((success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
                *)&local_b8);
    region::~region((region *)local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_330._1_7_,local_330[0]) != &local_320) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_330._1_7_,local_330[0]),
                      (ulong)(local_320._M_allocated_capacity + 1));
    }
LAB_0036e4cb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT71(local_3b8.field_2._M_allocated_capacity._1_7_,
                               local_3b8.field_2._M_local_buf[0]) + 1);
    }
    local_350.field_2._M_allocated_capacity = local_398.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p == &local_398.field_2) goto LAB_0036e660;
  }
  operator_delete(local_398._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
LAB_0036e660:
  region::~region((region *)local_260);
  location::~location(&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<typename basic_value<TC>::string_type, region>, error_info>
parse_basic_string_only(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    auto reg = syntax::basic_string(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_basic_string: "
            "invalid string format",
            syntax::basic_string(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    auto str = reg.as_string();

    assert(str.back() == '\"');
    str.pop_back();
    assert(str.at(0) == '\"');
    str.erase(0, 1);

    using string_type = typename basic_value<TC>::string_type;
    using char_type   = typename string_type::value_type;
    string_type val;

    {
        auto iter = str.begin();
        while(iter != str.end())
        {
            if(*iter == '\\')
            {
                auto loc2 = make_temporary_location(make_string(iter, str.end()));

                auto esc = parse_escape_sequence(loc2, ctx);

                // syntax does not check its value. the unicode codepoint may be
                // invalid, e.g. out-of-bound, [0xD800, 0xDFFF]
                if(esc.is_err())
                {
                    return err(esc.unwrap_err());
                }

                val += esc.unwrap();
                std::advance(iter, loc2.get_location());
            }
            else
            {
                val += char_type(*iter); // we already checked the syntax.
                ++iter;
            }
        }
    }
    return ok(std::make_pair(val, reg));
}